

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclBufSize.c
# Opt level: O0

Abc_Ntk_t * Abc_SclBufferingPerform(Abc_Ntk_t *pNtk,SC_Lib *pLib,SC_BusPars *pPars)

{
  Vec_Int_t *p_00;
  int iVar1;
  Bus_Man_t *p_01;
  Bus_Man_t *p;
  Abc_Ntk_t *pNtkNew;
  SC_BusPars *pPars_local;
  SC_Lib *pLib_local;
  Abc_Ntk_t *pNtk_local;
  
  iVar1 = Abc_SclCheckNtk(pNtk,0);
  if (iVar1 == 0) {
    pNtk_local = (Abc_Ntk_t *)0x0;
  }
  else {
    Abc_SclReportDupFanins(pNtk);
    Abc_SclMioGates2SclGates(pLib,pNtk);
    p_01 = Bus_ManStart(pNtk,pLib,pPars);
    Bus_ManReadInOutLoads(p_01);
    Abc_SclBufSize(p_01,(float)pPars->GainRatio * 0.01);
    Bus_ManStop(p_01);
    Abc_SclSclGates2MioGates(pLib,pNtk);
    if (pNtk->vPhases != (Vec_Int_t *)0x0) {
      p_00 = pNtk->vPhases;
      iVar1 = Abc_NtkObjNumMax(pNtk);
      Vec_IntFillExtra(p_00,iVar1,0);
    }
    pNtk_local = Abc_NtkDupDfs(pNtk);
  }
  return pNtk_local;
}

Assistant:

Abc_Ntk_t * Abc_SclBufferingPerform( Abc_Ntk_t * pNtk, SC_Lib * pLib, SC_BusPars * pPars )
{
    Abc_Ntk_t * pNtkNew;
    Bus_Man_t * p;
    if ( !Abc_SclCheckNtk( pNtk, 0 ) )
        return NULL;
    Abc_SclReportDupFanins( pNtk );
    Abc_SclMioGates2SclGates( pLib, pNtk );
    p = Bus_ManStart( pNtk, pLib, pPars );
    Bus_ManReadInOutLoads( p );
    Abc_SclBufSize( p, 0.01 * pPars->GainRatio );
    Bus_ManStop( p );
    Abc_SclSclGates2MioGates( pLib, pNtk );
    if ( pNtk->vPhases )
        Vec_IntFillExtra( pNtk->vPhases, Abc_NtkObjNumMax(pNtk), 0 );
    pNtkNew = Abc_NtkDupDfs( pNtk );
    return pNtkNew;
}